

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::WriteTextCommandWithDirectGlyphSelection
          (AbstractContentContext *this,GlyphUnicodeMappingList *inText,ITextCommand *inTextCommand)

{
  GraphicStateStack *this_00;
  double dVar1;
  bool bVar2;
  EStatusCode EVar3;
  int iVar4;
  PDFUsedFont *this_01;
  Trace *pTVar5;
  undefined4 extraout_var;
  GraphicState *pGVar6;
  _List_node_base *p_Var7;
  bool writeAsCID;
  char formattingBuffer [5];
  ObjectIDType fontObjectID;
  OutputStringBufferStream stringStream;
  string local_88;
  UShortList encodedCharactersList;
  string fontName;
  
  this_01 = GetCurrentFont(this);
  if (this_01 == (PDFUsedFont *)0x0) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::WriteTextCommandWithDirectGlyphSelection, Cannot write text, no current font is defined"
                     );
    return eFailure;
  }
  encodedCharactersList.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node._M_size = 0;
  encodedCharactersList.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&encodedCharactersList;
  encodedCharactersList.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&encodedCharactersList;
  EVar3 = PDFUsedFont::EncodeStringForShowing
                    (this_01,inText,&fontObjectID,&encodedCharactersList,&writeAsCID);
  if (EVar3 != eSuccess) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractcontextContext::WriteTextCommandWithDirectGlyphSelection, Unexepcted failure, Cannot encode characters"
                     );
    EVar3 = eFailure;
    goto LAB_0016ef94;
  }
  EVar3 = eSuccess;
  if ((encodedCharactersList.super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
       _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&encodedCharactersList)
     || (fontObjectID == 0)) goto LAB_0016ef94;
  iVar4 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddFontMapping_abi_cxx11_
            (&fontName,(ResourcesDictionary *)CONCAT44(extraout_var,iVar4),fontObjectID);
  this_00 = &this->mGraphicStack;
  pGVar6 = GraphicStateStack::GetCurrentState(this_00);
  bVar2 = std::operator!=(&pGVar6->mPlacedFontName,&fontName);
  if (bVar2) {
LAB_0016ee92:
    pGVar6 = GraphicStateStack::GetCurrentState(this_00);
    TfLow(this,&fontName,pGVar6->mFontSize);
  }
  else {
    pGVar6 = GraphicStateStack::GetCurrentState(this_00);
    dVar1 = pGVar6->mPlacedFontSize;
    pGVar6 = GraphicStateStack::GetCurrentState(this_00);
    if ((dVar1 != pGVar6->mFontSize) || (NAN(dVar1) || NAN(pGVar6->mFontSize))) goto LAB_0016ee92;
  }
  OutputStringBufferStream::OutputStringBufferStream(&stringStream);
  if (writeAsCID == false) {
    for (p_Var7 = encodedCharactersList.
                  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
                  super__List_node_base._M_next; p_Var7 != (_List_node_base *)&encodedCharactersList
        ; p_Var7 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var7->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next) {
      formattingBuffer[0] = *(char *)&p_Var7[1]._M_next;
      OutputStringBufferStream::Write(&stringStream,(Byte *)formattingBuffer,1);
    }
    OutputStringBufferStream::ToString_abi_cxx11_(&local_88,&stringStream);
    (*inTextCommand->_vptr_ITextCommand[1])(inTextCommand,&local_88);
  }
  else {
    for (p_Var7 = encodedCharactersList.
                  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
                  super__List_node_base._M_next; p_Var7 != (_List_node_base *)&encodedCharactersList
        ; p_Var7 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var7->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next) {
      formattingBuffer[0] = *(char *)((long)&p_Var7[1]._M_next + 1);
      OutputStringBufferStream::Write(&stringStream,(Byte *)formattingBuffer,1);
      formattingBuffer[0] = *(char *)&p_Var7[1]._M_next;
      OutputStringBufferStream::Write(&stringStream,(Byte *)formattingBuffer,1);
    }
    OutputStringBufferStream::ToString_abi_cxx11_(&local_88,&stringStream);
    (**inTextCommand->_vptr_ITextCommand)(inTextCommand,&local_88);
  }
  std::__cxx11::string::~string((string *)&local_88);
  OutputStringBufferStream::~OutputStringBufferStream(&stringStream);
  std::__cxx11::string::~string((string *)&fontName);
  EVar3 = eSuccess;
LAB_0016ef94:
  std::__cxx11::_List_base<unsigned_short,_std::allocator<unsigned_short>_>::_M_clear
            (&encodedCharactersList.
              super__List_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return EVar3;
}

Assistant:

EStatusCode AbstractContentContext::WriteTextCommandWithDirectGlyphSelection(const GlyphUnicodeMappingList& inText,ITextCommand* inTextCommand)
{
	PDFUsedFont* currentFont = GetCurrentFont();
	if(!currentFont)
	{
		TRACE_LOG("AbstractContentContext::WriteTextCommandWithDirectGlyphSelection, Cannot write text, no current font is defined");
		return PDFHummus::eFailure;
	}

	ObjectIDType fontObjectID;
	UShortList encodedCharactersList;
	bool writeAsCID;	

	if(currentFont->EncodeStringForShowing(inText,fontObjectID,encodedCharactersList,writeAsCID) != PDFHummus::eSuccess)
	{
		TRACE_LOG("AbstractcontextContext::WriteTextCommandWithDirectGlyphSelection, Unexepcted failure, Cannot encode characters");
		return PDFHummus::eFailure;
	}
	
	// skip if there's no text going to be written (also means no font ID)
	if(encodedCharactersList.empty() || 0 == fontObjectID)
		return PDFHummus::eSuccess;

	// Write the font reference (only if required)
	std::string fontName = GetResourcesDictionary()->AddFontMapping(fontObjectID);

	if(mGraphicStack.GetCurrentState().mPlacedFontName != fontName ||
		mGraphicStack.GetCurrentState().mPlacedFontSize != mGraphicStack.GetCurrentState().mFontSize)
		TfLow(fontName,mGraphicStack.GetCurrentState().mFontSize);
	
	// Now write the string using the text command
	OutputStringBufferStream stringStream;
	char formattingBuffer[5];
	UShortList::iterator it = encodedCharactersList.begin();
	if(writeAsCID)
	{
		for(;it!= encodedCharactersList.end();++it)
		{
			formattingBuffer[0] = ((*it) >> 8) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer, 1);
			formattingBuffer[0] = (*it) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer, 1);
		}
		inTextCommand->WriteHexStringCommand(stringStream.ToString());
	}
	else
	{
		for(;it!= encodedCharactersList.end();++it)
		{
			formattingBuffer[0] = (*it) & 0x00ff;
			stringStream.Write((const Byte*)formattingBuffer,1);
		}
		inTextCommand->WriteLiteralStringCommand(stringStream.ToString());	
	}
	return PDFHummus::eSuccess;
}